

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.c
# Opt level: O0

void test_msg_insert_header(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  nng_msg *msg;
  
  nVar1 = nng_msg_alloc((nng_msg **)&result__1,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x4a,"%s: expected success, got %s (%d)","nng_msg_alloc(&msg, 0)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_header_append(_result__1,"def",4);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x4b,"%s: expected success, got %s (%d)",
                         "nng_msg_header_append(msg, \"def\", 4)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_header_insert(_result__1,"abc",3);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x4c,"%s: expected success, got %s (%d)",
                         "nng_msg_header_insert(msg, \"abc\", 3)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  sVar4 = nng_msg_header_len(_result__1);
  iVar2 = acutest_check_((uint)(sVar4 == 7),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x4d,"%s","nng_msg_header_len(msg) == 7");
  if (iVar2 == 0) {
    acutest_abort_();
  }
  pcVar3 = (char *)nng_msg_header(_result__1);
  iVar2 = strcmp(pcVar3,"abcdef");
  iVar2 = acutest_check_((uint)(iVar2 == 0),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x4e,"%s","strcmp(nng_msg_header(msg), \"abcdef\") == 0");
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nng_msg_free(_result__1);
  return;
}

Assistant:

void
test_msg_insert_header(void)
{
	nng_msg *msg;
	NUTS_PASS(nng_msg_alloc(&msg, 0));
	NUTS_PASS(nng_msg_header_append(msg, "def", 4));
	NUTS_PASS(nng_msg_header_insert(msg, "abc", 3));
	NUTS_ASSERT(nng_msg_header_len(msg) == 7);
	NUTS_ASSERT(strcmp(nng_msg_header(msg), "abcdef") == 0);
	nng_msg_free(msg);
}